

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
::init(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
       *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  undefined4 extraout_var;
  ShaderProgram *pSVar2;
  ProgramSources *pPVar3;
  long lVar4;
  TestError *pTVar5;
  allocator<char> local_192;
  allocator<char> local_191;
  undefined1 local_190 [40];
  string local_168;
  string local_148;
  undefined1 local_128 [40];
  ProgramSources local_100;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (this->m_useGL == true) {
    pSVar2 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(&local_100,0,0xac);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,
               "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,&local_191);
    glu::VertexSource::VertexSource((VertexSource *)local_190,&local_148);
    pPVar3 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void)\n{\n\tdEQP_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
               ,&local_192);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_128,&local_168);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_128);
    glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx,pPVar3);
    this->m_dummyProgram = pSVar2;
    std::__cxx11::string::~string((string *)(local_128 + 8));
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)(local_190 + 8));
    std::__cxx11::string::~string((string *)&local_148);
    glu::ProgramSources::~ProgramSources(&local_100);
    pSVar2 = this->m_dummyProgram;
    if ((pSVar2->m_program).m_info.linkOk == false) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar2
                     );
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"failed to build shader program",(allocator<char> *)local_190)
      ;
      tcu::TestError::TestError(pTVar5,(string *)&local_100);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar4 = (**(code **)(lVar4 + 0x780))((pSVar2->m_program).m_program,"a_position");
    this->m_dummyProgramPosLoc = (int)lVar4;
    if ((int)lVar4 == -1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"a_position location was -1",(allocator<char> *)local_190);
      tcu::TestError::TestError(pTVar5,(string *)&local_100);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return (int)lVar4;
}

Assistant:

void BasicBufferCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_useGL)
		return;

	// \note Viewport size is not checked, it won't matter if the render target actually is smaller hhan DUMMY_RENDER_AREA_SIZE

	// dummy shader

	m_dummyProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_dummyVertexShader) << glu::FragmentSource(s_dummyFragnentShader));
	if (!m_dummyProgram->isOk())
	{
		m_testCtx.getLog() << *m_dummyProgram;
		throw tcu::TestError("failed to build shader program");
	}

	m_dummyProgramPosLoc = gl.getAttribLocation(m_dummyProgram->getProgram(), "a_position");
	if (m_dummyProgramPosLoc == -1)
		throw tcu::TestError("a_position location was -1");
}